

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O0

tuple<int,_int>
burst::detail::
by_all_impl<0ul,1ul,DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::__0_const,std::tuple<int,int>>
          (_Tuple_impl<0UL,_int,_int> param_1,__0 *param_2,tuple<int,_int> *param_3)

{
  tuple<int,_int> *this;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var1;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var2;
  int local_30;
  int local_2c;
  tuple<int,_int> *local_28;
  tuple<int,_int> *t_local;
  anon_class_1_0_00000001 *f_local;
  _Tuple_impl<0UL,_int,_int> local_10;
  
  local_28 = param_3;
  t_local = (tuple<int,_int> *)param_2;
  local_10 = param_1;
  p_Var1 = std::get<0ul,int,int>(param_3);
  local_2c = DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::$_0::operator()(param_2,*p_Var1);
  this = t_local;
  p_Var2 = std::get<1ul,int,int>(local_28);
  local_30 = DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::$_0::operator()((__0 *)this,*p_Var2);
  std::tuple<int,_int>::tuple<int,_int,_true>((tuple<int,_int> *)param_1,&local_2c,&local_30);
  return (tuple<int,_int>)param_1;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }